

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sign.c
# Opt level: O3

void print_test_result(int err)

{
  if (err == 0) {
    puts("\x1b[1;31mfailure\x1b[m");
    return;
  }
  if (err == 1) {
    puts("\x1b[1;32msuccess\x1b[m");
    return;
  }
  ERR_print_errors_fp(_stderr);
  return;
}

Assistant:

static void print_test_result(int err)
{
    if (err == 1)
	printf(cGREEN "success" cNORM "\n");
    else if (err == 0)
	printf(cRED "failure" cNORM "\n");
    else
	ERR_print_errors_fp(stderr);
}